

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::ParsedScene::MediumInterface
          (ParsedScene *this,string *insideName,string *outsideName,FileLoc loc)

{
  if (this->currentApiState == Uninitialized) {
    Error<char_const(&)[16]>
              (&loc,"pbrtInit() must be before calling \"%s()\". Ignoring.",
               (char (*) [16])"MediumInterface");
    return;
  }
  std::__cxx11::string::_M_assign((string *)this->graphicsState);
  std::__cxx11::string::_M_assign((string *)&this->graphicsState->currentOutsideMedium);
  return;
}

Assistant:

void ParsedScene::MediumInterface(const std::string &insideName,
                                  const std::string &outsideName, FileLoc loc) {
    VERIFY_INITIALIZED("MediumInterface");
    graphicsState->currentInsideMedium = insideName;
    graphicsState->currentOutsideMedium = outsideName;
}